

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::PropertyEnumStepEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  if (evt->EventKind != PropertyEnumTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(evt[1].EventKind != Invalid),1);
  FileWriter::WriteUInt32(writer,propertyId,evt[1].ResultStatus,CommaSeparator);
  FileWriter::WriteUInt32(writer,attributeFlags,(uint)(byte)evt[1].EventTimeStamp,CommaSeparator);
  if (evt[1].EventKind != Invalid) {
    FileWriter::WriteString(writer,stringVal,(TTString *)(evt + 2),CommaSeparator);
    return;
  }
  return;
}

Assistant:

void PropertyEnumStepEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const PropertyEnumStepEventLogEntry* propertyEvt = GetInlineEventDataAs<PropertyEnumStepEventLogEntry, EventKind::PropertyEnumTag>(evt);

            writer->WriteBool(NSTokens::Key::boolVal, !!propertyEvt->ReturnCode, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::propertyId, propertyEvt->Pid, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::attributeFlags, propertyEvt->Attributes, NSTokens::Separator::CommaSeparator);

            if(propertyEvt->ReturnCode)
            {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                writer->WriteString(NSTokens::Key::stringVal, propertyEvt->PropertyString, NSTokens::Separator::CommaSeparator);
#else
                if(propertyEvt->Pid == Js::Constants::NoProperty)
                {
                    writer->WriteString(NSTokens::Key::stringVal, propertyEvt->PropertyString, NSTokens::Separator::CommaSeparator);
                }
#endif
            }
        }